

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O2

void __thiscall dlib::file::file(file *this,string *name)

{
  (this->state).name._M_dataplus._M_p = (pointer)&(this->state).name.field_2;
  (this->state).name._M_string_length = 0;
  (this->state).name.field_2._M_local_buf[0] = '\0';
  (this->state).full_name._M_dataplus._M_p = (pointer)&(this->state).full_name.field_2;
  (this->state).full_name._M_string_length = 0;
  (this->state).full_name.field_2._M_local_buf[0] = '\0';
  (this->state).last_modified.__d.__r = 0;
  init(this,(EVP_PKEY_CTX *)name);
  return;
}

Assistant:

file (
            const std::string& name
        ) { init(name); }